

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpparser.c
# Opt level: O1

parse_status_t parser_parse_entity(http_parser_t *parser)

{
  membuffer *m;
  size_t *psVar1;
  size_t sVar2;
  int iVar3;
  parse_status_t pVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  undefined1 local_40 [16];
  
  if (parser->position != POS_ENTITY) {
    __assert_fail("parser->position == POS_ENTITY",".upnp/src/genlib/net/http/httpparser.c",0x7a1,
                  "parse_status_t parser_parse_entity(http_parser_t *)");
  }
  m = &(parser->msg).msg;
  do {
    switch(parser->ent_position) {
    case 1:
      pVar4 = parser_get_entity_read_method(parser);
      break;
    case 2:
      sVar6 = (parser->msg).amount_discarded;
      sVar2 = parser->entity_start_position;
      uVar7 = ((parser->msg).msg.length - sVar2) + sVar6;
      (parser->msg).entity.length = uVar7;
      uVar5 = (ulong)parser->content_length;
      pVar4 = PARSE_INCOMPLETE;
      if (uVar5 <= uVar7) {
        if (uVar5 < uVar7) {
          (parser->msg).msg.buf[uVar5 + (sVar2 - sVar6)] = '\0';
        }
        (parser->msg).entity.length = (ulong)parser->content_length;
        (parser->msg).entity.buf = (parser->msg).msg.buf + parser->entity_start_position;
        parser->position = POS_COMPLETE;
LAB_0010c970:
        pVar4 = PARSE_SUCCESS;
      }
      break;
    case 3:
      sVar6 = (parser->scanner).cursor;
      pVar4 = match(&parser->scanner,"%x%L%c",&parser->chunk_size,local_40);
      if (pVar4 == PARSE_OK) {
        membuffer_delete(m,sVar6,(parser->scanner).cursor - sVar6);
        (parser->scanner).cursor = sVar6;
        iVar3 = 5;
        if (parser->chunk_size == 0) {
          (parser->msg).entity.length =
               (sVar6 - parser->entity_start_position) + (parser->msg).amount_discarded;
          iVar3 = 6;
        }
        parser->ent_position = iVar3;
LAB_0010c858:
        pVar4 = PARSE_CONTINUE_1;
      }
      else {
        (parser->scanner).cursor = sVar6;
        UpnpPrintf(UPNP_INFO,HTTP,".upnp/src/genlib/net/http/httpparser.c",0x6e8,
                   "CHUNK COULD NOT BE PARSED\n");
      }
      break;
    case 4:
      sVar6 = (parser->msg).msg.length;
      sVar2 = parser->entity_start_position;
      (parser->msg).entity.length = (sVar6 - sVar2) + (parser->msg).amount_discarded;
      (parser->msg).entity.buf = (parser->msg).msg.buf + sVar2;
      (parser->scanner).cursor = sVar6;
      pVar4 = PARSE_INCOMPLETE_ENTITY;
      break;
    case 5:
      sVar6 = (parser->scanner).cursor;
      pVar4 = PARSE_INCOMPLETE;
      if (parser->chunk_size <= (parser->msg).msg.length - sVar6) {
        sVar6 = parser->chunk_size + sVar6;
        (parser->scanner).cursor = sVar6;
        pVar4 = match(&parser->scanner,"%c");
        if (pVar4 == PARSE_OK) {
          membuffer_delete(m,sVar6,(parser->scanner).cursor - sVar6);
          (parser->scanner).cursor = sVar6;
          psVar1 = &(parser->msg).entity.length;
          *psVar1 = *psVar1 + parser->chunk_size;
          parser->ent_position = 3;
          goto LAB_0010c858;
        }
        psVar1 = &(parser->scanner).cursor;
        *psVar1 = *psVar1 - parser->chunk_size;
      }
      break;
    case 6:
      sVar6 = (parser->scanner).cursor;
      pVar4 = parser_parse_headers(parser);
      if (pVar4 == PARSE_OK) {
        parser->position = POS_COMPLETE;
        membuffer_delete(m,sVar6,(parser->scanner).cursor - sVar6);
        (parser->scanner).cursor = sVar6;
        (parser->msg).entity.buf = (parser->msg).msg.buf + parser->entity_start_position;
        goto LAB_0010c970;
      }
      break;
    default:
      __assert_fail("0",".upnp/src/genlib/net/http/httpparser.c",0x7bf,
                    "parse_status_t parser_parse_entity(http_parser_t *)");
    }
    if (pVar4 != PARSE_CONTINUE_1) {
      return pVar4;
    }
  } while( true );
}

Assistant:

parse_status_t parser_parse_entity(http_parser_t *parser)
{
	parse_status_t status;

	assert(parser->position == POS_ENTITY);

	do {
		switch (parser->ent_position) {
		case ENTREAD_USING_CLEN:
			status = parser_parse_entity_using_clen(parser);
			break;

		case ENTREAD_USING_CHUNKED:
			status = parser_parse_chunky_entity(parser);
			break;

		case ENTREAD_CHUNKY_BODY:
			status = parser_parse_chunky_body(parser);
			break;

		case ENTREAD_CHUNKY_HEADERS:
			status = parser_parse_chunky_headers(parser);
			break;

		case ENTREAD_UNTIL_CLOSE:
			status = parser_parse_entity_until_close(parser);
			break;

		case ENTREAD_DETERMINE_READ_METHOD:
			status = parser_get_entity_read_method(parser);
			break;

		default:
			status = PARSE_FAILURE;
			assert(0);
		}

	} while (status == (parse_status_t)PARSE_CONTINUE_1);

	return status;
}